

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O3

int get8(stbi *s)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  
  if ((FILE *)s->img_file != (FILE *)0x0) {
    iVar2 = fgetc((FILE *)s->img_file);
    iVar3 = 0;
    if (iVar2 != -1) {
      iVar3 = iVar2;
    }
    return iVar3;
  }
  pbVar1 = s->img_buffer;
  uVar4 = 0;
  if (pbVar1 < s->img_buffer_end) {
    s->img_buffer = pbVar1 + 1;
    uVar4 = (uint)*pbVar1;
  }
  return uVar4;
}

Assistant:

__forceinline static int get8(stbi *s)
{
#ifndef STBI_NO_STDIO
   if (s->img_file) {
      int c = fgetc(s->img_file);
      return c == EOF ? 0 : c;
   }
#endif
   if (s->img_buffer < s->img_buffer_end)
      return *s->img_buffer++;
   return 0;
}